

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void __thiscall boost::deflate::inflate_stream_test::Matrix::Matrix(Matrix *this)

{
  Matrix *this_local;
  
  this->level_[0] = 0;
  this->level_[1] = 9;
  this->window_[0] = 9;
  this->window_[1] = 0xf;
  this->strategy_[0] = 0;
  this->strategy_[1] = 4;
  return;
}

Assistant:

explicit
        Matrix()
        {
            level_[0] = 0;
            level_[1] = 9;
            window_[0] = 9;
            window_[1] = 15;
            strategy_[0] = 0;
            strategy_[1] = 4;
        }